

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

int Abc_FlowRetime_IsAcrossCut(Abc_Obj_t *pObj,Abc_Obj_t *pNext)

{
  Flow_Data_t *pFVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pNext_local;
  Abc_Obj_t *pObj_local;
  
  pFVar1 = pManMR->pDataArray;
  uVar2 = Abc_ObjId(pObj);
  if (((undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x2) !=
       (undefined1  [24])0x0) &&
     (pFVar1 = pManMR->pDataArray, uVar2 = Abc_ObjId(pObj),
     (undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x1) ==
     (undefined1  [24])0x0)) {
    if (pManMR->fIsForward == 0) {
      pFVar1 = pManMR->pDataArray;
      uVar2 = Abc_ObjId(pNext);
      if (((undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x1) !=
           (undefined1  [24])0x0) ||
         (pFVar1 = pManMR->pDataArray, uVar2 = Abc_ObjId(pNext),
         (undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x8) !=
         (undefined1  [24])0x0)) {
        return 1;
      }
    }
    else {
      pFVar1 = pManMR->pDataArray;
      uVar2 = Abc_ObjId(pNext);
      if (((((undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x2) ==
             (undefined1  [24])0x0) ||
           (pFVar1 = pManMR->pDataArray, uVar2 = Abc_ObjId(pNext),
           (*(ushort *)(pFVar1 + uVar2) & 0x90 & pManMR->constraintMask) != 0)) ||
          (pFVar1 = pManMR->pDataArray, uVar2 = Abc_ObjId(pNext),
          (undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x8) !=
          (undefined1  [24])0x0)) || (iVar3 = Abc_ObjIsLatch(pNext), iVar3 != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
Abc_FlowRetime_IsAcrossCut( Abc_Obj_t *pObj, Abc_Obj_t *pNext ) {

  if (FTEST(pObj, VISITED_R) && !FTEST(pObj, VISITED_E)) {
    if (pManMR->fIsForward) {
      if (!FTEST(pNext, VISITED_R) || 
          (FTEST(pNext, BLOCK_OR_CONS) & pManMR->constraintMask)|| 
          FTEST(pNext, CROSS_BOUNDARY) || 
          Abc_ObjIsLatch(pNext))
        return 1;
    } else {
      if (FTEST(pNext, VISITED_E) ||
          FTEST(pNext, CROSS_BOUNDARY))
        return 1;
    }
  }
  
  return 0;
}